

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<cs::csym_info&&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
           *this,size_t i,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<cs::csym_info_&&> *args_2)

{
  __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>::
  construct<std::pair<std::__cxx11::string,cs::csym_info>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<cs::csym_info&&>>
            ((new_allocator<std::pair<std::__cxx11::string_const,cs::csym_info>> *)(this + 0x28),
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>
              *)(i * 0x70 + *(long *)(this + 8)),args,args_1,args_2);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args)
			{
				PolicyTraits::construct(&alloc_ref(), slots_ + i,
				                        std::forward<Args>(args)...);

#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
				// this check can be costly, so do it only when requested
				assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
				       iterator_at(i) &&
				       "constructed value does not match the lookup key");
#endif
			}